

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O2

int Abc_SopIsOrType(char *pSop)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  char cVar6;
  
  iVar1 = Abc_SopGetVarNum(pSop);
  iVar2 = Abc_SopGetCubeNum(pSop);
  if (iVar1 == iVar2) {
    pcVar3 = pSop + 1;
    iVar2 = 1;
    for (; cVar6 = *pSop, cVar6 != '\0'; pSop = pSop + (iVar1 + 3)) {
      iVar4 = 0;
      pcVar5 = pcVar3;
      while (cVar6 != ' ') {
        iVar4 = iVar4 + (uint)(cVar6 != '-');
        cVar6 = *pcVar5;
        pcVar5 = pcVar5 + 1;
      }
      if (iVar4 != 1) goto LAB_001de936;
      pcVar3 = pcVar3 + (iVar1 + 3);
    }
  }
  else {
LAB_001de936:
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int Abc_SopIsOrType( char * pSop )
{
    char * pCube, * pCur;
    int nVars, nLits;
    nVars = Abc_SopGetVarNum( pSop );
    if ( nVars != Abc_SopGetCubeNum(pSop) )
        return 0;
    Abc_SopForEachCube( pSop, nVars, pCube )
    {
        // count the number of literals in the cube
        nLits = 0;
        for ( pCur = pCube; *pCur != ' '; pCur++ )
            nLits += ( *pCur != '-' );
        if ( nLits != 1 )
            return 0;
    }
    return 1;
}